

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

int canvas_undo_recreate(_glist *x,void *z,int action)

{
  int iVar1;
  int *piVar2;
  _binbuf *p_Var3;
  _undo *p_Var4;
  t_undo_create *buf2;
  t_gobj *y;
  t_undo_create *buf;
  int action_local;
  void *z_local;
  _glist *x_local;
  
  buf2 = (t_undo_create *)0x0;
  if (action == 1) {
    iVar1 = glist_getindex(x,(t_gobj *)0x0);
    buf2 = (t_undo_create *)glist_nth(x,iVar1 + -1);
  }
  else if (action == 2) {
    buf2 = (t_undo_create *)glist_nth(x,*z);
  }
  if ((action == 1) && (iVar1 = canvas_undo_confirmdiscard((t_gobj *)buf2), iVar1 != 0)) {
    x_local._4_4_ = 0;
  }
  else {
    if ((action == 1) || (action == 2)) {
      piVar2 = (int *)getbytes(0x18);
      *piVar2 = *z;
      p_Var3 = binbuf_new();
      *(_binbuf **)(piVar2 + 2) = p_Var3;
      gobj_save((t_gobj *)buf2,*(_binbuf **)(piVar2 + 2));
      p_Var3 = binbuf_duplicate(*(_binbuf **)((long)z + 0x10));
      *(_binbuf **)(piVar2 + 4) = p_Var3;
      glist_noselect(x);
      glist_select(x,(t_gobj *)buf2);
      canvas_doclear(x);
      canvas_applybinbuf(x,*(_binbuf **)((long)z + 8));
      canvas_applybinbuf(x,*(_binbuf **)((long)z + 0x10));
      binbuf_free(*(_binbuf **)((long)z + 8));
      binbuf_free(*(_binbuf **)((long)z + 0x10));
      freebytes(z,0x18);
      p_Var4 = canvas_undo_get(x);
      p_Var4->u_last->data = piVar2;
      if ((action == 1) &&
         ((iVar1 = canvas_apply_restore_original_position(x,*piVar2), iVar1 != 0 &&
          ((*(ushort *)&x->field_0xe8 & 1) != 0)))) {
        canvas_redraw(x);
      }
      if ((pd_maininstance.pd_newest != (t_pd *)0x0) && (*pd_maininstance.pd_newest == canvas_class)
         ) {
        canvas_loadbang((_glist *)pd_maininstance.pd_newest);
      }
      if (action == 2) {
        iVar1 = glist_getindex(x,(t_gobj *)0x0);
        buf2 = (t_undo_create *)glist_nth(x,iVar1 + -1);
      }
      else {
        buf2 = (t_undo_create *)glist_nth(x,*piVar2);
      }
      glist_select(x,(t_gobj *)buf2);
    }
    else if (action == 0) {
      binbuf_free(*(_binbuf **)((long)z + 8));
      binbuf_free(*(_binbuf **)((long)z + 0x10));
      freebytes(z,0x18);
    }
    x_local._4_4_ = 1;
  }
  return x_local._4_4_;
}

Assistant:

int canvas_undo_recreate(t_canvas *x, void *z, int action)
{
    t_undo_create *buf = z;
    t_gobj *y = NULL;
    if (action == UNDO_UNDO)
        y = glist_nth(x, glist_getindex(x, 0) - 1);
    else if (action == UNDO_REDO)
        y = glist_nth(x, buf->u_index);

        /* check if we are undoing the creation of a dirty abstraction;
         * if so, bail out */
    if ((action == UNDO_UNDO)
        && canvas_undo_confirmdiscard(y))
            return 0;

    if (action == UNDO_UNDO || action == UNDO_REDO)
    {
            /* first copy new state of the current object */
        t_undo_create *buf2 = (t_undo_create *)getbytes(sizeof(*buf));
        buf2->u_index = buf->u_index;

        buf2->u_objectbuf = binbuf_new();
        gobj_save(y, buf2->u_objectbuf);

        buf2->u_reconnectbuf = binbuf_duplicate(buf->u_reconnectbuf);

            /* now cut the existing object */
        glist_noselect(x);
        glist_select(x, y);
        canvas_doclear(x);

            /* then paste the old object */

            /* save and clear bindings to symbols #A, #N, #X; restore when done */
        canvas_applybinbuf(x, buf->u_objectbuf);
        canvas_applybinbuf(x, buf->u_reconnectbuf);

            /* free the old data */
        binbuf_free(buf->u_objectbuf);
        binbuf_free(buf->u_reconnectbuf);
        t_freebytes(buf, sizeof(*buf));

            /* re-adjust pointer
             * (this should probably belong into g_undo.c, but since it is
             * a unique case, we'll let it be for the time being)
             */
        canvas_undo_get(x)->u_last->data = (void *)buf2;
        buf = buf2;

            /* reposition object to its original place */
        if (action == UNDO_UNDO)
            if (canvas_apply_restore_original_position(x, buf->u_index) && x->gl_havewindow)
                canvas_redraw(x);

            /* send a loadbang */
        if (pd_this->pd_newest && pd_class(pd_this->pd_newest) == canvas_class)
            canvas_loadbang((t_canvas *)pd_this->pd_newest);

            /* select */
        if (action == UNDO_REDO)
            y = glist_nth(x, glist_getindex(x, 0) - 1);
        else
            y = glist_nth(x, buf->u_index);
        glist_select(x, y);
    }
    else if (action == UNDO_FREE)
    {
        binbuf_free(buf->u_objectbuf);
        binbuf_free(buf->u_reconnectbuf);
        t_freebytes(buf, sizeof(*buf));
    }
    return 1;
}